

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

IfcVector3 * __thiscall
Assimp::IFC::anon_unknown_9::Line::Eval(IfcVector3 *__return_storage_ptr__,Line *this,IfcFloat u)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (this->v).z;
  dVar2 = (this->p).z;
  dVar3 = (this->p).y;
  dVar4 = (this->v).y;
  __return_storage_ptr__->x = u * (this->v).x + (this->p).x;
  __return_storage_ptr__->y = u * dVar4 + dVar3;
  __return_storage_ptr__->z = dVar1 * u + dVar2;
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 Eval(IfcFloat u) const {
        return p + u*v;
    }